

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceVersionWrapper.cpp
# Opt level: O2

void * __thiscall
ResourceVersionWrapper::getFieldPtr(ResourceVersionWrapper *this,size_t fId,size_t subField)

{
  version_info *pvVar1;
  
  pvVar1 = getVersionInfo(this);
  if (pvVar1 == (version_info *)0x0) {
    pvVar1 = (version_info *)0x0;
  }
  else {
    switch(fId) {
    case 1:
      pvVar1 = (version_info *)&pvVar1->valueLength;
      break;
    case 2:
      pvVar1 = (version_info *)&pvVar1->type;
      break;
    case 3:
      pvVar1 = (version_info *)pvVar1->key;
      break;
    case 4:
      pvVar1 = (version_info *)&pvVar1->Value;
      break;
    case 5:
      pvVar1 = (version_info *)&(pvVar1->Value).dwStrucVersion;
      break;
    case 6:
      pvVar1 = (version_info *)&(pvVar1->Value).dwFileVersionMS;
      break;
    case 7:
      pvVar1 = (version_info *)&(pvVar1->Value).dwFileVersionLS;
      break;
    case 8:
      pvVar1 = (version_info *)&(pvVar1->Value).dwProductVersionMS;
      break;
    case 9:
      pvVar1 = (version_info *)&(pvVar1->Value).dwProductVersionLS;
      break;
    case 10:
      pvVar1 = (version_info *)&(pvVar1->Value).dwFileFlagsMask;
      break;
    case 0xb:
      pvVar1 = (version_info *)&(pvVar1->Value).dwFileFlags;
      break;
    case 0xc:
      pvVar1 = (version_info *)&(pvVar1->Value).dwFileOS;
      break;
    case 0xd:
      pvVar1 = (version_info *)&(pvVar1->Value).dwFileType;
      break;
    case 0xe:
      pvVar1 = (version_info *)&(pvVar1->Value).dwFileSubtype;
      break;
    case 0xf:
      pvVar1 = (version_info *)&(pvVar1->Value).dwFileDateMS;
      break;
    case 0x10:
      pvVar1 = (version_info *)&(pvVar1->Value).dwFileDateLS;
      break;
    case 0x11:
      pvVar1 = (version_info *)&pvVar1->children;
    }
  }
  return pvVar1;
}

Assistant:

void* ResourceVersionWrapper::getFieldPtr(size_t fId, size_t subField)
{
    pe::version_info* ptr = getVersionInfo();

    if (ptr == NULL) return NULL;

    switch (fId) {
        case STRUCT_LEN: return &(ptr->length);
        case VAL_LEN: return &(ptr->valueLength);
        case STRUCT_TYPE: return &(ptr->type);
        case INFO: return &(ptr->key);

        case SIGNATURE: return &(ptr->Value.dwSignature);
        case STRUCT_VER: return &(ptr->Value.dwStrucVersion);
        case FILE_VER_0: return &(ptr->Value.dwFileVersionMS);
        case FILE_VER_1: return &(ptr->Value.dwFileVersionLS);

        case PRODUCT_VER_0: return &(ptr->Value.dwProductVersionMS);
        case PRODUCT_VER_1: return &(ptr->Value.dwProductVersionLS);

        case FLAGS_MASK: return &(ptr->Value.dwFileFlagsMask);
        case FLAGS: return &(ptr->Value.dwFileFlags);
        case OS: return &(ptr->Value.dwFileOS);
        case TYPE: return &(ptr->Value.dwFileType);
        case SUBTYPE: return &(ptr->Value.dwFileSubtype);
        case TIMESTAMP_0: return &(ptr->Value.dwFileDateMS);
        case TIMESTAMP_1: return &(ptr->Value.dwFileDateLS);

        //case PADDING2: return &(ptr->padding2);
        case CHILDREN: return &(ptr->children);
    }
    return ptr;
}